

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O3

unique_ptr<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
 __thiscall Storage::Tape::MSX::Parser::find_header(Parser *this,BinaryTapePlayer *tape_player)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  IntType IVar4;
  IntType IVar5;
  undefined1 *puVar6;
  int iVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float local_70;
  undefined8 *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  
  bVar1 = BinaryTapePlayer::get_motor_control(tape_player);
  if (bVar1) {
    bVar1 = BinaryTapePlayer::get_input(tape_player);
    fVar12 = 1.1754944e-38;
    fVar11 = 3.4028235e+38;
    iVar7 = 0;
    do {
      TapePlayer::get_tape(&tape_player->super_TapePlayer);
      cVar2 = (**(code **)*local_68)();
      if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
      }
      if (cVar2 != '\0') break;
      local_70 = 0.0;
      do {
        IVar4 = TimedEventLoop::get_cycles_until_next_event((TimedEventLoop *)tape_player);
        IVar5 = TimedEventLoop::get_input_clock_rate((TimedEventLoop *)tape_player);
        local_70 = local_70 + (float)IVar4 / (float)IVar5;
        TapePlayer::run_for_input_pulse(&tape_player->super_TapePlayer);
        bVar3 = BinaryTapePlayer::get_input(tape_player);
      } while (bVar1 == bVar3);
      bVar1 = BinaryTapePlayer::get_input(tape_player);
      fVar9 = local_70;
      if (fVar11 <= local_70) {
        fVar9 = fVar11;
      }
      if (local_70 <= fVar12) {
        local_70 = fVar12;
      }
      iVar7 = iVar7 + 1;
      fVar10 = local_70 - fVar9;
      fVar12 = 1.1754944e-38;
      if (fVar10 <= 3.5e-05) {
        fVar12 = local_70;
      }
      fVar11 = (float)(~-(uint)(3.5e-05 < fVar10) & (uint)fVar9 |
                      -(uint)(3.5e-05 < fVar10) & 0x7f7fffff);
      if (3.5e-05 < fVar10) {
        iVar7 = 0;
      }
    } while (iVar7 != 0x8ae);
    TapePlayer::get_tape(&tape_player->super_TapePlayer);
    cVar2 = (**(code **)*local_68)();
    if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
    }
    if (cVar2 == '\0') {
      iVar7 = 0x200;
      local_70 = 0.0;
      do {
        TapePlayer::get_tape(&tape_player->super_TapePlayer);
        cVar2 = (**(code **)*local_68)();
        if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
        }
        if (cVar2 != '\0') goto LAB_004501e7;
        IVar4 = TimedEventLoop::get_cycles_until_next_event((TimedEventLoop *)tape_player);
        IVar5 = TimedEventLoop::get_input_clock_rate((TimedEventLoop *)tape_player);
        local_70 = local_70 + (float)IVar4 / (float)IVar5;
        bVar3 = BinaryTapePlayer::get_input(tape_player);
        if (bVar3 != bVar1) {
          iVar7 = iVar7 + -1;
          if (iVar7 == 0) goto LAB_004501e7;
          bVar1 = BinaryTapePlayer::get_input(tape_player);
        }
        TapePlayer::run_for_input_pulse(&tape_player->super_TapePlayer);
      } while( true );
    }
  }
LAB_0045021a:
  *(undefined8 *)this = 0;
  return (__uniq_ptr_data<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>,_true,_true>
          )(__uniq_ptr_data<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>,_true,_true>
            )this;
LAB_004501e7:
  TapePlayer::get_tape(&tape_player->super_TapePlayer);
  cVar2 = (**(code **)*local_68)();
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if (cVar2 == '\0') {
    uVar8 = (uint)((local_70 * 0.00390625) / 8.5875e-06);
    puVar6 = (undefined1 *)operator_new(2);
    *(undefined1 **)this = puVar6;
    *puVar6 = (char)uVar8;
    puVar6[1] = (char)((uVar8 & 0xff) * 3 >> 2);
    return (__uniq_ptr_data<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>,_true,_true>
            )(__uniq_ptr_data<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>,_true,_true>
              )this;
  }
  goto LAB_0045021a;
}

Assistant:

std::unique_ptr<Parser::FileSpeed> Parser::find_header(Storage::Tape::BinaryTapePlayer &tape_player) {
	if(!tape_player.get_motor_control()) {
		return nullptr;
	}

	/*
		"When 1,111 cycles have been found with less than 35 microseconds
		variation in their lengths a header has been located."
	*/
	bool last_level = tape_player.get_input();
	float low = std::numeric_limits<float>::max();
	float high = std::numeric_limits<float>::min();
	int samples = 0;
	while(!tape_player.get_tape()->is_at_end()) {
		float next_length = 0.0f;
		do {
			next_length += float(tape_player.get_cycles_until_next_event()) / float(tape_player.get_input_clock_rate());
			tape_player.run_for_input_pulse();
		} while(last_level == tape_player.get_input());
		last_level = tape_player.get_input();
		low = std::min(low, next_length);
		high = std::max(high, next_length);
		samples++;
		if(high - low > 0.000035f) {
			low = std::numeric_limits<float>::max();
			high = std::numeric_limits<float>::min();
			samples = 0;
		}
		if(samples == 1111*2) break;	// Cycles are read, not half-cycles.
	}

	if(tape_player.get_tape()->is_at_end()) return nullptr;

	/*
		"The next 256 cycles are then read (1B34H) and averaged to determine the cassette HI cycle length."
	*/
	float total_length = 0.0f;
	samples = 512;
	while(!tape_player.get_tape()->is_at_end()) {
		total_length += float(tape_player.get_cycles_until_next_event()) / float(tape_player.get_input_clock_rate());
		if(tape_player.get_input() != last_level) {
			samples--;
			if(!samples) break;
			last_level = tape_player.get_input();
		}
		tape_player.run_for_input_pulse();
	}

	if(tape_player.get_tape()->is_at_end()) return nullptr;

	/*
		This figure is multiplied by 1.5 and placed in LOWLIM where it defines the minimum acceptable length
		of a 0 start bit. The HI cycle length is placed in WINWID and will be used to discriminate
		between LO and HI cycles."
	*/
	total_length = total_length / 256.0f;			// To get the average, in microseconds.
	// To convert to the loop count format used by the MSX BIOS.
	uint8_t int_result = uint8_t(total_length / (0.00001145f * 0.75f));

	auto result = std::make_unique<FileSpeed>();
	result->minimum_start_bit_duration = int_result;
	result->low_high_disrimination_duration = (int_result * 3) >> 2;

	return result;
}